

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.c
# Opt level: O1

Tokenizer * tok_init(char *ifs)

{
  Tokenizer *__ptr;
  char *pcVar1;
  char **__ptr_00;
  char *pcVar2;
  
  __ptr = (Tokenizer *)malloc(0x48);
  if (__ptr != (Tokenizer *)0x0) {
    pcVar1 = "\t \n";
    if (ifs != (char *)0x0) {
      pcVar1 = ifs;
    }
    pcVar1 = strdup(pcVar1);
    __ptr->ifs = pcVar1;
    if (pcVar1 != (char *)0x0) {
      __ptr->argc = 0;
      __ptr->amax = 10;
      __ptr_00 = (char **)malloc(0x50);
      __ptr->argv = __ptr_00;
      if (__ptr_00 != (char **)0x0) {
        *__ptr_00 = (char *)0x0;
        pcVar2 = (char *)malloc(0x14);
        __ptr->wspace = pcVar2;
        if (pcVar2 != (char *)0x0) {
          __ptr->wmax = pcVar2 + 0x14;
          __ptr->wstart = pcVar2;
          __ptr->wptr = pcVar2;
          __ptr->quote = Q_none;
          __ptr->flags = 0;
          return __ptr;
        }
        free(__ptr_00);
      }
      free(pcVar1);
    }
    free(__ptr);
  }
  return (Tokenizer *)0x0;
}

Assistant:

TYPE(Tokenizer) *
FUN(tok,init)(const Char *ifs)
{
	TYPE(Tokenizer) *tok = tok_malloc(sizeof(*tok));

	if (tok == NULL)
		return NULL;
	tok->ifs = tok_strdup(ifs ? ifs : IFS);
	if (tok->ifs == NULL) {
		tok_free(tok);
		return NULL;
	}
	tok->argc = 0;
	tok->amax = AINCR;
	tok->argv = tok_malloc(sizeof(*tok->argv) * tok->amax);
	if (tok->argv == NULL) {
		tok_free(tok->ifs);
		tok_free(tok);
		return NULL;
	}
	tok->argv[0] = NULL;
	tok->wspace = tok_malloc(WINCR * sizeof(*tok->wspace));
	if (tok->wspace == NULL) {
		tok_free(tok->argv);
		tok_free(tok->ifs);
		tok_free(tok);
		return NULL;
	}
	tok->wmax = tok->wspace + WINCR;
	tok->wstart = tok->wspace;
	tok->wptr = tok->wspace;
	tok->flags = 0;
	tok->quote = Q_none;

	return tok;
}